

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::php::anon_unknown_0::PhpGeneratorTest_GroupFieldError_Test::
PhpGeneratorTest_GroupFieldError_Test(PhpGeneratorTest_GroupFieldError_Test *this)

{
  PhpGeneratorTest_GroupFieldError_Test *this_local;
  
  PhpGeneratorTest::PhpGeneratorTest(&this->super_PhpGeneratorTest);
  (this->super_PhpGeneratorTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__PhpGeneratorTest_GroupFieldError_Test_02a12558;
  return;
}

Assistant:

TEST_F(PhpGeneratorTest, GroupFieldError) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto2";
    message Foo {
      optional group Bar = 1 {
        optional int32 baz = 1;
      };
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");

  ExpectErrorSubstring("Can't generate PHP code for group field Foo.bar");
}